

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::TraverseSchema::checkAttDerivationOK
          (TraverseSchema *this,DOMElement *elem,XercesAttGroupInfo *baseAttGrpInfo,
          XercesAttGroupInfo *childAttGrpInfo)

{
  DefAttTypes DVar1;
  DefAttTypes DVar2;
  QName *pQVar3;
  XMLCh *baseName;
  bool bVar4;
  int iVar5;
  SchemaAttDef *pSVar6;
  SchemaAttDef *pSVar7;
  XMLSize_t XVar8;
  XMLSize_t i;
  XMLSize_t XVar9;
  XMLSize_t XVar10;
  int iStackY_80;
  SchemaAttDef *local_58;
  XMLSize_t local_40;
  
  if (baseAttGrpInfo->fAttributes == (RefVectorOf<xercesc_4_0::SchemaAttDef> *)0x0) {
    XVar9 = 0;
  }
  else {
    XVar9 = (baseAttGrpInfo->fAttributes->super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef>).
            fCurCount;
  }
  if (baseAttGrpInfo->fAnyAttributes == (RefVectorOf<xercesc_4_0::SchemaAttDef> *)0x0) {
    XVar8 = 0;
  }
  else {
    XVar8 = (baseAttGrpInfo->fAnyAttributes->super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef>).
            fCurCount;
  }
  if (childAttGrpInfo->fAttributes == (RefVectorOf<xercesc_4_0::SchemaAttDef> *)0x0) {
    local_40 = 0;
  }
  else {
    local_40 = (childAttGrpInfo->fAttributes->super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef>).
               fCurCount;
  }
  if (childAttGrpInfo->fAnyAttributes == (RefVectorOf<xercesc_4_0::SchemaAttDef> *)0x0) {
    XVar10 = 0;
  }
  else {
    XVar10 = (childAttGrpInfo->fAnyAttributes->super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef>).
             fCurCount;
  }
  if ((XVar9 == 0 && XVar8 == 0) && (XVar10 != 0 || local_40 != 0)) {
    reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x6d);
  }
  if (XVar8 == 0) {
    local_58 = (SchemaAttDef *)0x0;
  }
  else {
    local_58 = XercesAttGroupInfo::anyAttributeAt(baseAttGrpInfo,0);
  }
  XVar9 = 0;
  do {
    if (local_40 == XVar9) {
      if ((XVar10 != 0) &&
         (pSVar6 = XercesAttGroupInfo::anyAttributeAt(childAttGrpInfo,0),
         pSVar6 != (SchemaAttDef *)0x0)) {
        if (local_58 == (SchemaAttDef *)0x0) {
          iStackY_80 = 0x72;
        }
        else {
          bVar4 = isWildCardSubset((TraverseSchema *)childAttGrpInfo,local_58,pSVar6);
          if (bVar4) {
            if ((local_58->super_XMLAttDef).fDefaultType <= (pSVar6->super_XMLAttDef).fDefaultType)
            {
              return;
            }
            iStackY_80 = 0x75;
          }
          else {
            iStackY_80 = 0x73;
          }
        }
        reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,iStackY_80);
        return;
      }
      return;
    }
    pSVar6 = XercesAttGroupInfo::attributeAt(childAttGrpInfo,XVar9);
    pQVar3 = pSVar6->fAttName;
    baseName = pQVar3->fLocalPart;
    pSVar7 = XercesAttGroupInfo::getAttDef(baseAttGrpInfo,baseName,pQVar3->fURIId);
    if (pSVar7 == (SchemaAttDef *)0x0) {
      iVar5 = 0x71;
      if (local_58 != (SchemaAttDef *)0x0) {
        bVar4 = wildcardAllowsNamespace(this,local_58,pQVar3->fURIId);
        iVar5 = 0x71;
LAB_0031a045:
        if (bVar4 != false) goto LAB_0031a06d;
      }
LAB_0031a04a:
      reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,iVar5,baseName,(XMLCh *)0x0,
                        (XMLCh *)0x0,(XMLCh *)0x0);
    }
    else {
      DVar1 = (pSVar7->super_XMLAttDef).fDefaultType;
      DVar2 = (pSVar6->super_XMLAttDef).fDefaultType;
      if ((DVar1 == DefAttTypes_Max) && (DVar2 != DefAttTypes_Max)) {
        reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x74,baseName,(XMLCh *)0x0,
                          (XMLCh *)0x0,(XMLCh *)0x0);
      }
      if (((DVar1 & Required) != DefAttTypes_Min) && ((DVar2 & Required) == DefAttTypes_Min)) {
        reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x6e,baseName,(XMLCh *)0x0,
                          (XMLCh *)0x0,(XMLCh *)0x0);
      }
      if (DVar2 != DefAttTypes_Max) {
        if ((pSVar7->fDatatypeValidator == (DatatypeValidator *)0x0) ||
           (iVar5 = (*(pSVar7->fDatatypeValidator->super_XSerializable)._vptr_XSerializable[9])(),
           (char)iVar5 == '\0')) {
          reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x6f,baseName,(XMLCh *)0x0,
                            (XMLCh *)0x0,(XMLCh *)0x0);
        }
        if ((DVar1 & Fixed) != DefAttTypes_Min) {
          iVar5 = 0x70;
          if ((DVar2 & Fixed) != DefAttTypes_Min) {
            bVar4 = XMLString::equals((pSVar7->super_XMLAttDef).fValue,
                                      (pSVar6->super_XMLAttDef).fValue);
            iVar5 = 0x70;
            goto LAB_0031a045;
          }
          goto LAB_0031a04a;
        }
      }
    }
LAB_0031a06d:
    XVar9 = XVar9 + 1;
  } while( true );
}

Assistant:

void TraverseSchema::checkAttDerivationOK(const DOMElement* const elem,
                                          const XercesAttGroupInfo* const baseAttGrpInfo,
                                          const XercesAttGroupInfo* const childAttGrpInfo) {

    XMLSize_t baseAttCount = baseAttGrpInfo->attributeCount();
    XMLSize_t baseAnyAttCount = baseAttGrpInfo->anyAttributeCount();
    XMLSize_t childAttCount = childAttGrpInfo->attributeCount();
    XMLSize_t childAnyAttCount = childAttGrpInfo->anyAttributeCount();

    if ((childAttCount || childAnyAttCount) && (!baseAttCount && !baseAnyAttCount)) {
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_1);
    }

    const SchemaAttDef* baseAttWildCard = (baseAnyAttCount) ? baseAttGrpInfo->anyAttributeAt(0) : 0;

    for (XMLSize_t i=0; i<childAttCount; i++) {

        const SchemaAttDef* childAttDef = childAttGrpInfo->attributeAt(i);
        QName* childAttName = childAttDef->getAttName();
        const XMLCh* childLocalPart = childAttName->getLocalPart();
        const SchemaAttDef* baseAttDef = baseAttGrpInfo->getAttDef(childLocalPart, childAttName->getURI());

        if (baseAttDef) {

            XMLAttDef::DefAttTypes baseAttDefType = baseAttDef->getDefaultType();
            XMLAttDef::DefAttTypes childAttDefType = childAttDef->getDefaultType();

            // Constraint 2.1.1 & 3 + check for prohibited base attribute
            if (baseAttDefType == XMLAttDef::Prohibited
                && childAttDefType != XMLAttDef::Prohibited) {
                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_8, childLocalPart);
            }

            if ((baseAttDefType & XMLAttDef::Required)
                && !(childAttDefType & XMLAttDef::Required)) {
                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_2, childLocalPart);
            }

            // if the attribute in the derived type is prohibited, and it didn't try to override a required attribute,
            // it's ok and shouldn't be tested for data type or fixed value
            if (childAttDefType == XMLAttDef::Prohibited)
                continue;

            // Constraint 2.1.2
            DatatypeValidator* baseDV = baseAttDef->getDatatypeValidator();
            DatatypeValidator* childDV = childAttDef->getDatatypeValidator();
            if (!baseDV || !baseDV->isSubstitutableBy(childDV)) {
                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_3, childLocalPart);
            }

            // Constraint 2.1.3
            if ((baseAttDefType & XMLAttDef::Fixed) &&
                (!(childAttDefType & XMLAttDef::Fixed) ||
                 !XMLString::equals(baseAttDef->getValue(), childAttDef->getValue()))) {
                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_4, childLocalPart);
            }
        }
        // Constraint 2.2
        else if (!baseAttWildCard ||
                 !wildcardAllowsNamespace(baseAttWildCard, childAttName->getURI())) {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_5, childLocalPart);
        }
    }

    // Constraint 4
    const SchemaAttDef* childAttWildCard = (childAnyAttCount) ? childAttGrpInfo->anyAttributeAt(0) : 0;

    if (childAttWildCard) {

        if (!baseAttWildCard) {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_6);
        }
        else if (!isWildCardSubset(baseAttWildCard, childAttWildCard)) {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_7);
        }
        else if (childAttWildCard->getDefaultType() < baseAttWildCard->getDefaultType()) {
            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BadAttDerivation_9);
        }
    }
}